

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

int Curl_ssl_backend(void)

{
  multissl_init((Curl_ssl *)0x0);
  return (Curl_ssl->info).id;
}

Assistant:

int Curl_ssl_backend(void)
{
#ifdef USE_SSL
  multissl_init(NULL);
  return Curl_ssl->info.id;
#else
  return (int)CURLSSLBACKEND_NONE;
#endif
}